

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string * __thiscall
yy::parser::yytnamerr__abi_cxx11_(string *__return_storage_ptr__,parser *this,char *yystr)

{
  char cVar1;
  string *yyr;
  parser *ppVar2;
  allocator<char> local_19;
  
  if (*(char *)&this->_vptr_parser == '\"') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ppVar2 = this;
    do {
      cVar1 = *(char *)((long)&ppVar2->_vptr_parser + 1);
      if (cVar1 == '\\') {
        if (*(char *)((long)&ppVar2->_vptr_parser + 2) != '\\') goto LAB_001057af;
        ppVar2 = (parser *)((long)&ppVar2->_vptr_parser + 2);
      }
      else {
        if (cVar1 == '\"') {
          return __return_storage_ptr__;
        }
        if ((cVar1 == '\'') || (cVar1 == ',')) goto LAB_001057af;
        ppVar2 = (parser *)((long)&ppVar2->_vptr_parser + 1);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    } while( true );
  }
LAB_001057b7:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)this,&local_19);
  return __return_storage_ptr__;
LAB_001057af:
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  goto LAB_001057b7;
}

Assistant:

std::string
  parser::yytnamerr_ (const char *yystr)
  {
    if (*yystr == '"')
      {
        std::string yyr;
        char const *yyp = yystr;

        for (;;)
          switch (*++yyp)
            {
            case '\'':
            case ',':
              goto do_not_strip_quotes;

            case '\\':
              if (*++yyp != '\\')
                goto do_not_strip_quotes;
              else
                goto append;

            append:
            default:
              yyr += *yyp;
              break;

            case '"':
              return yyr;
            }
      do_not_strip_quotes: ;
      }

    return yystr;
  }